

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

string * __thiscall
DataRefs::GetXPSimTimeStr_abi_cxx11_(string *__return_storage_ptr__,DataRefs *this)

{
  allocator<char> local_c9;
  time_t xp_t;
  tm xp_tm;
  char s [100];
  
  xp_t = this->lastXPSimTime_ms / 1000;
  gmtime_r(&xp_t,(tm *)&xp_tm);
  strftime(s,100,"%Y-%m-%d %H:%M:%S UTC",(tm *)&xp_tm);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,s,&local_c9);
  return __return_storage_ptr__;
}

Assistant:

std::string DataRefs::GetXPSimTimeStr() const
{
    char s[100];
    time_t xp_t = time_t(lastXPSimTime_ms / 1000L);
    struct tm xp_tm;
    gmtime_s(&xp_tm, &xp_t);
    std::strftime(s, sizeof(s), "%Y-%m-%d %H:%M:%S UTC", &xp_tm);
    return s;
}